

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O2

Pipeline *
buildEmptyPipelineModelWithStringOutput
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,char *outTensorName)

{
  ulong uVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this;
  Pipeline *pPVar5;
  undefined8 *puVar6;
  int i;
  int iVar7;
  
  pMVar2 = CoreML::Specification::Model::_internal_mutable_description(m);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  uVar1 = (pFVar3->super_MessageLite)._internal_metadata_.ptr_;
  puVar6 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar6 = (undefined8 *)*puVar6;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&pFVar3->name_,inTensorAttr->name,puVar6);
  pFVar4 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar3);
  this = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar4);
  this->datatype_ = 0x10020;
  for (iVar7 = 0; iVar7 < inTensorAttr->dimension; iVar7 = iVar7 + 1) {
    CoreML::Specification::ArrayFeatureType::_internal_add_shape(this,1);
  }
  pMVar2 = CoreML::Specification::Model::_internal_mutable_description(m);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  uVar1 = (pFVar3->super_MessageLite)._internal_metadata_.ptr_;
  puVar6 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar6 = (undefined8 *)*puVar6;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar3->name_,outTensorName,puVar6)
  ;
  pFVar4 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar3);
  CoreML::Specification::FeatureType::_internal_mutable_stringtype(pFVar4);
  m->specificationversion_ = 4;
  pPVar5 = CoreML::Specification::Model::_internal_mutable_pipeline(m);
  if (isUpdatable) {
    m->isupdatable_ = true;
  }
  return pPVar5;
}

Assistant:

Specification::Pipeline* buildEmptyPipelineModelWithStringOutput(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, const char *outTensorName) {
    auto inTensor = m.mutable_description()->add_input();
    inTensor->set_name(inTensorAttr->name);
    auto inTensorShape = inTensor->mutable_type()->mutable_multiarraytype();
    inTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < inTensorAttr->dimension; i++) {
        inTensorShape->add_shape(1);
    }
    
    auto outTensor = m.mutable_description()->add_output();
    outTensor->set_name(outTensorName);
    outTensor->mutable_type()->mutable_stringtype();
    
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    
    auto pipeline = m.mutable_pipeline();
    
    if (isUpdatable) {
        m.set_isupdatable(true);
    }
    
    return pipeline;
}